

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

int mu_begin_window_ex(mu_Context *ctx,char *title,mu_Rect rect,int opt)

{
  mu_Rect *pmVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  mu_Vec2 mVar5;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int extraout_EAX;
  size_t sVar12;
  mu_Container *cnt;
  long lVar13;
  mu_Command *pmVar14;
  long lVar15;
  int iVar16;
  mu_Vec2 mVar17;
  ulong extraout_RDX;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  mu_Container *pmVar24;
  mu_Context *ctx_00;
  int iVar25;
  int iVar26;
  ulong uVar27;
  mu_Id mVar28;
  ulong uVar29;
  mu_Rect mVar30;
  mu_Rect rect_00;
  mu_Rect mVar31;
  mu_Rect mVar32;
  mu_Rect rect_01;
  mu_Rect mVar33;
  mu_Rect mVar34;
  mu_Rect rect_02;
  mu_Rect body;
  mu_Rect rect_03;
  mu_Rect rect_04;
  mu_Rect rect_05;
  mu_Rect body_00;
  mu_Rect rect_06;
  mu_Rect rect_07;
  mu_Rect rect_08;
  char local_74;
  
  uVar19 = (ulong)(uint)opt;
  sVar12 = strlen(title);
  uVar21 = (ctx->id_stack).idx;
  mVar17.y = 0;
  mVar17.x = uVar21;
  if ((int)uVar21 < 1) {
    pmVar24 = (mu_Container *)0x811c9dc5;
  }
  else {
    mVar17.x = uVar21 - 1;
    mVar17.y = 0;
    pmVar24 = (mu_Container *)(ulong)(ctx->id_stack).items[(long)mVar17];
  }
  if ((int)sVar12 != 0) {
    mVar17.x = 0;
    mVar17.y = 0;
    do {
      pmVar24 = (mu_Container *)
                (ulong)(((uint)(byte)title[(long)mVar17] ^ (uint)pmVar24) * 0x1000193);
      mVar17 = (mu_Vec2)((long)mVar17 + 1);
    } while ((int)sVar12 != mVar17.x);
  }
  mVar28 = (mu_Id)pmVar24;
  ctx->last_id = mVar28;
  ctx_00 = ctx;
  cnt = get_container(ctx,mVar28,opt);
  if ((cnt == (mu_Container *)0x0) || (cnt->open == 0)) {
    return 0;
  }
  lVar13 = (long)(ctx->id_stack).idx;
  if (lVar13 < 0x20) {
    (ctx->id_stack).items[lVar13] = mVar28;
    (ctx->id_stack).idx = (ctx->id_stack).idx + 1;
    if ((((uint)opt >> 0xd & 1) != 0) || ((cnt->rect).w == 0)) {
      (cnt->rect).x = (int)rect._0_8_;
      (cnt->rect).y = (int)((ulong)rect._0_8_ >> 0x20);
      (cnt->rect).w = (int)rect._8_8_;
      (cnt->rect).h = (int)((ulong)rect._8_8_ >> 0x20);
    }
    iVar16 = (ctx->container_stack).idx;
    if (0x1f < (long)iVar16) goto LAB_001495a3;
    (ctx->container_stack).items[iVar16] = cnt;
    (ctx->container_stack).idx = iVar16 + 1;
    iVar16 = (ctx->root_list).idx;
    if ((long)iVar16 < 0x20) {
      (ctx->root_list).items[iVar16] = cnt;
      (ctx->root_list).idx = iVar16 + 1;
      pmVar24 = (mu_Container *)0x1;
      ctx_00 = ctx;
      pmVar14 = mu_push_command(ctx,1,0x10);
      (pmVar14->jump).dst = (void *)0x0;
      cnt->head = pmVar14;
      uVar3 = (cnt->rect).x;
      uVar6 = (cnt->rect).y;
      mVar5 = ctx->mouse_pos;
      mVar17 = mVar5;
      if ((int)uVar3 <= mVar5.x) {
        uVar4 = (cnt->rect).w;
        uVar7 = (cnt->rect).h;
        pmVar24 = (mu_Container *)(ulong)(uint)(uVar4 + uVar3);
        if (mVar5.x < (int)(uVar4 + uVar3)) {
          mVar17 = (mu_Vec2)((ulong)mVar5 >> 0x20);
          if ((((int)uVar6 <= mVar5.y) && (mVar5.y < (int)(uVar7 + uVar6))) &&
             ((ctx->next_hover_root == (mu_Container *)0x0 ||
              (mVar17.y = 0, mVar17.x = cnt->zindex, ctx->next_hover_root->zindex < cnt->zindex))))
          {
            ctx->next_hover_root = cnt;
          }
        }
      }
      lVar13 = (long)(ctx->clip_stack).idx;
      if (lVar13 < 0x20) {
        (ctx->clip_stack).items[lVar13] = unclipped_rect;
        (ctx->clip_stack).idx = (ctx->clip_stack).idx + 1;
        pmVar1 = &cnt->rect;
        uVar19._0_4_ = pmVar1->x;
        uVar19._4_4_ = pmVar1->y;
        uVar18._0_4_ = (cnt->rect).w;
        uVar18._4_4_ = (cnt->rect).h;
        uVar23 = uVar19 >> 0x20;
        if ((opt & 8U) == 0) {
          (*ctx->draw_frame)(ctx,*pmVar1,2);
        }
        local_74 = (char)opt;
        uVar29 = uVar18;
        if (-1 < local_74) {
          uVar21 = ctx->style->title_height;
          lVar13 = ((ulong)uVar21 << 0x20) + (uVar18 & 0xffffffff);
          mVar30._8_8_ = lVar13;
          mVar30.x = (undefined4)uVar19;
          mVar30.y = uVar19._4_4_;
          (*ctx->draw_frame)(ctx,mVar30,3);
          iVar16 = (ctx->id_stack).idx;
          if (iVar16 < 1) {
            uVar20 = 0x811c9dc5;
          }
          else {
            uVar20 = (ctx->id_stack).items[iVar16 - 1];
          }
          lVar15 = 0;
          do {
            uVar20 = ((byte)"!title"[lVar15] ^ uVar20) * 0x1000193;
            lVar15 = lVar15 + 1;
          } while ((int)lVar15 != 6);
          ctx->last_id = uVar20;
          rect_03._8_8_ = lVar13;
          rect_03.x = (undefined4)uVar19;
          rect_03.y = uVar19._4_4_;
          mu_update_control(ctx,uVar20,rect_03,opt);
          rect_04._8_8_ = lVar13;
          rect_04.x = (undefined4)uVar19;
          rect_04.y = uVar19._4_4_;
          mu_draw_control_text(ctx,title,rect_04,4,opt);
          if ((uVar20 == ctx->focus) && (ctx->mouse_down == 1)) {
            (cnt->rect).x = (cnt->rect).x + (ctx->mouse_delta).x;
            piVar2 = &(cnt->rect).y;
            *piVar2 = *piVar2 + (ctx->mouse_delta).y;
          }
          uVar23 = (ulong)(uVar21 + uVar19._4_4_);
          uVar29 = ((ulong)(uVar18._4_4_ - uVar21) << 0x20) + (uVar18 & 0xffffffff);
          if ((opt & 0x40U) == 0) {
            iVar16 = (ctx->id_stack).idx;
            if (iVar16 < 1) {
              mVar28 = 0x811c9dc5;
            }
            else {
              mVar28 = (ctx->id_stack).items[iVar16 - 1];
            }
            lVar13 = 0;
            do {
              mVar28 = ((byte)"!close"[lVar13] ^ mVar28) * 0x1000193;
              lVar13 = lVar13 + 1;
            } while ((int)lVar13 != 6);
            ctx->last_id = mVar28;
            uVar27 = (ulong)(((undefined4)uVar18 + (undefined4)uVar19) - uVar21) |
                     uVar19 & 0xffffffff00000000;
            mu_draw_icon(ctx,1,(mu_Rect)CONCAT88(CONCAT44(uVar21,uVar21),
                                                 CONCAT44((int)(uVar27 >> 0x20),(int)uVar27)),
                         ctx->style->colors[4]);
            rect_05.w = uVar21;
            rect_05.h = uVar21;
            rect_05.x = (int)uVar27;
            rect_05.y = (int)(uVar27 >> 0x20);
            mu_update_control(ctx,mVar28,rect_05,opt);
            if ((ctx->mouse_pressed == 1) && (mVar28 == ctx->focus)) {
              cnt->open = 0;
            }
          }
        }
        body_00.w = (int)uVar29;
        body_00.h = (int)(uVar29 >> 0x20);
        body_00._0_8_ = (uVar23 << 0x20) + (uVar19 & 0xffffffff);
        push_container_body(ctx,cnt,body_00,opt);
        if ((opt & 0x10U) == 0) {
          iVar16 = ctx->style->title_height;
          iVar8 = (ctx->id_stack).idx;
          if (iVar8 < 1) {
            uVar21 = 0x811c9dc5;
          }
          else {
            uVar21 = (ctx->id_stack).items[iVar8 - 1];
          }
          lVar13 = 0;
          do {
            uVar21 = ((byte)"!resize"[lVar13] ^ uVar21) * 0x1000193;
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 7);
          ctx->last_id = uVar21;
          rect_06.x = ((undefined4)uVar18 + (undefined4)uVar19) - iVar16;
          rect_06.y = (uVar18._4_4_ + uVar19._4_4_) - iVar16;
          rect_06.h = iVar16;
          rect_06.w = iVar16;
          mu_update_control(ctx,uVar21,rect_06,opt);
          if ((uVar21 == ctx->focus) && (ctx->mouse_down == 1)) {
            iVar8 = (ctx->mouse_delta).x + (cnt->rect).w;
            iVar16 = 0x60;
            if (0x60 < iVar8) {
              iVar16 = iVar8;
            }
            (cnt->rect).w = iVar16;
            iVar8 = (ctx->mouse_delta).y + (cnt->rect).h;
            iVar16 = 0x40;
            if (0x40 < iVar8) {
              iVar16 = iVar8;
            }
            (cnt->rect).h = iVar16;
          }
        }
        if (((uint)opt >> 9 & 1) != 0) {
          lVar13 = (long)(ctx->layout_stack).idx;
          iVar16 = (cnt->content_size).y;
          iVar8 = (ctx->layout_stack).items[lVar13 + -1].body.h;
          piVar2 = &(cnt->rect).w;
          *piVar2 = *piVar2 + ((cnt->content_size).x -
                              *(int *)((long)&ctx->id_stack + lVar13 * 0x8c + 4));
          piVar2 = &(cnt->rect).h;
          *piVar2 = *piVar2 + (iVar16 - iVar8);
        }
        if (((((uint)opt >> 10 & 1) != 0) && (ctx->mouse_pressed != 0)) && (ctx->hover_root != cnt))
        {
          cnt->open = 0;
        }
        mu_push_clip_rect(ctx,cnt->body);
        return 1;
      }
      goto LAB_001495ad;
    }
  }
  else {
    mu_begin_window_ex_cold_1();
LAB_001495a3:
    mu_begin_window_ex_cold_2();
  }
  mu_begin_window_ex_cold_3();
LAB_001495ad:
  mu_begin_window_ex_cold_4();
  iVar16 = (int)extraout_RDX;
  iVar8 = (int)(extraout_RDX >> 0x20);
  if ((uVar19 & 0x20) == 0) {
    iVar11 = ctx_00->style->scrollbar_size;
    iVar25 = ctx_00->style->padding * 2;
    iVar22 = (pmVar24->content_size).x + iVar25;
    iVar25 = iVar25 + (pmVar24->content_size).y;
    rect_00.w = mVar17.x;
    rect_00.h = mVar17.y;
    rect_00.x = (int)extraout_RDX;
    rect_00.y = (int)(extraout_RDX >> 0x20);
    mu_push_clip_rect(ctx_00,rect_00);
    mVar5 = (mu_Vec2)((ulong)mVar17 & 0xffffffff00000000 | (ulong)(uint)(mVar17.x - iVar11));
    if (iVar25 <= (pmVar24->body).h) {
      mVar5 = mVar17;
    }
    mVar17 = mVar5;
    if ((pmVar24->body).w < iVar22) {
      mVar17 = (mu_Vec2)((ulong)mVar17 & 0xffffffff | (ulong)(uint)(mVar17.y - iVar11) << 0x20);
    }
    iVar11 = mVar17.y;
    iVar26 = mVar17.x;
    if ((iVar11 < 1) || (iVar9 = iVar25 - iVar11, iVar9 < 1)) {
      (pmVar24->scroll).y = 0;
    }
    else {
      iVar10 = (ctx_00->id_stack).idx;
      if (iVar10 < 1) {
        mVar28 = 0x811c9dc5;
      }
      else {
        mVar28 = (ctx_00->id_stack).items[iVar10 - 1];
      }
      lVar13 = 0;
      do {
        mVar28 = ((byte)"!scrollbary"[lVar13] ^ mVar28) * 0x1000193;
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0xb);
      ctx_00->last_id = mVar28;
      uVar19 = (ulong)(uint)ctx_00->style->scrollbar_size;
      uVar18 = (ulong)mVar17 & 0xffffffff00000000 | uVar19;
      uVar23 = extraout_RDX & 0xffffffff00000000 | (ulong)(uint)(iVar26 + iVar16);
      rect_07.w = (int)uVar18;
      rect_07.h = (int)(uVar18 >> 0x20);
      rect_07.x = (int)uVar23;
      rect_07.y = (int)(uVar23 >> 0x20);
      mu_update_control(ctx_00,mVar28,rect_07,0);
      if ((ctx_00->focus == mVar28) && (ctx_00->mouse_down == 1)) {
        piVar2 = &(pmVar24->scroll).y;
        *piVar2 = *piVar2 + ((ctx_00->mouse_delta).y * iVar25) / iVar11;
      }
      iVar10 = (pmVar24->scroll).y;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (iVar9 < iVar10) {
        iVar10 = iVar9;
      }
      (pmVar24->scroll).y = iVar10;
      mVar31.w = (int)uVar18;
      mVar31.h = (int)(uVar18 >> 0x20);
      mVar31.x = (int)uVar23;
      mVar31.y = (int)(uVar23 >> 0x20);
      (*ctx_00->draw_frame)(ctx_00,mVar31,0xc);
      uVar21 = ctx_00->style->thumb_size;
      uVar18 = (long)(ulong)(uint)(iVar11 * iVar11) / (long)iVar25;
      uVar23 = uVar18 & 0xffffffff;
      if ((int)uVar18 < (int)uVar21) {
        uVar23 = (ulong)uVar21;
      }
      mVar32.y = iVar8 + ((iVar11 - (int)uVar23) * (pmVar24->scroll).y) / iVar9;
      mVar32.x = iVar26 + iVar16;
      mVar32._8_8_ = (uVar23 << 0x20) + uVar19;
      (*ctx_00->draw_frame)(ctx_00,mVar32,0xd);
      rect_01.w = mVar17.x;
      rect_01.h = mVar17.y;
      rect_01.x = (int)extraout_RDX;
      rect_01.y = (int)(extraout_RDX >> 0x20);
      iVar11 = mu_mouse_over(ctx_00,rect_01);
      if (iVar11 != 0) {
        ctx_00->scroll_target = pmVar24;
      }
    }
    if ((iVar26 < 1) || (iVar11 = iVar22 - iVar26, iVar11 < 1)) {
      (pmVar24->scroll).x = 0;
    }
    else {
      iVar25 = (ctx_00->id_stack).idx;
      if (iVar25 < 1) {
        mVar28 = 0x811c9dc5;
      }
      else {
        mVar28 = (ctx_00->id_stack).items[iVar25 - 1];
      }
      lVar13 = 0;
      do {
        mVar28 = ((byte)"!scrollbarx"[lVar13] ^ mVar28) * 0x1000193;
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0xb);
      ctx_00->last_id = mVar28;
      uVar21 = ctx_00->style->scrollbar_size;
      uVar18 = CONCAT44(uVar21,iVar26) & 0xffffffff7fffffff;
      uVar19 = ((ulong)mVar17 & 0xffffffff00000000) + extraout_RDX;
      rect_08.w = (int)uVar18;
      rect_08.h = (int)(uVar18 >> 0x20);
      rect_08._0_8_ = uVar19;
      mu_update_control(ctx_00,mVar28,rect_08,0);
      if ((ctx_00->focus == mVar28) && (ctx_00->mouse_down == 1)) {
        (pmVar24->scroll).x = (pmVar24->scroll).x + ((ctx_00->mouse_delta).x * iVar22) / iVar26;
      }
      iVar25 = (pmVar24->scroll).x;
      if (iVar25 < 1) {
        iVar25 = 0;
      }
      if (iVar11 < iVar25) {
        iVar25 = iVar11;
      }
      (pmVar24->scroll).x = iVar25;
      mVar33.w = (int)uVar18;
      mVar33.h = (int)(uVar18 >> 0x20);
      mVar33._0_8_ = uVar19;
      (*ctx_00->draw_frame)(ctx_00,mVar33,0xc);
      uVar20 = ctx_00->style->thumb_size;
      uVar18 = (long)(ulong)(uint)(iVar26 * iVar26) / (long)iVar22;
      uVar23 = uVar18 & 0xffffffff;
      if ((int)uVar18 < (int)uVar20) {
        uVar23 = (ulong)uVar20;
      }
      uVar18 = (ulong)uVar21 << 0x20 | uVar23;
      mVar34._0_8_ = uVar19 & 0xffffffff00000000 |
                     (ulong)(uint)(((iVar26 - (int)uVar23) * (pmVar24->scroll).x) / iVar11 + iVar16)
      ;
      mVar34.w = (int)uVar18;
      mVar34.h = (int)(uVar18 >> 0x20);
      (*ctx_00->draw_frame)(ctx_00,mVar34,0xd);
      rect_02.w = mVar17.x;
      rect_02.h = mVar17.y;
      rect_02.x = (int)extraout_RDX;
      rect_02.y = (int)(extraout_RDX >> 0x20);
      iVar11 = mu_mouse_over(ctx_00,rect_02);
      if (iVar11 != 0) {
        ctx_00->scroll_target = pmVar24;
      }
    }
    mu_pop_clip_rect(ctx_00);
  }
  iVar11 = ctx_00->style->padding;
  body.x = iVar11 + iVar16;
  body.w = mVar17.x + iVar11 * -2;
  body.y = iVar8 + iVar11;
  body.h = mVar17.y + iVar11 * -2;
  push_layout(ctx_00,body,pmVar24->scroll);
  (pmVar24->body).x = (int)extraout_RDX;
  (pmVar24->body).y = (int)(extraout_RDX >> 0x20);
  (pmVar24->body).w = mVar17.x;
  (pmVar24->body).h = mVar17.y;
  return extraout_EAX;
}

Assistant:

int mu_begin_window_ex(mu_Context *ctx, const char *title, mu_Rect rect, int opt) {
  mu_Rect body;
  mu_Id id = mu_get_id(ctx, title, strlen(title));
  mu_Container *cnt = get_container(ctx, id, opt);
  if (!cnt || !cnt->open) { return 0; }
  push(ctx->id_stack, id);

  if (cnt->rect.w == 0 || opt & MU_OPT_FORCE_RESIZE) {
    cnt->rect = rect;
  }
  begin_root_container(ctx, cnt);
  rect = body = cnt->rect;

  /* draw frame */
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, rect, MU_COLOR_WINDOWBG);
  }

  /* do title bar */
  if (~opt & MU_OPT_NOTITLE) {
    mu_Rect tr = rect;
    tr.h = ctx->style->title_height;
    ctx->draw_frame(ctx, tr, MU_COLOR_TITLEBG);

    /* do title text */
    if (~opt & MU_OPT_NOTITLE) {
      mu_Id id = mu_get_id(ctx, "!title", 6);
      mu_update_control(ctx, id, tr, opt);
      mu_draw_control_text(ctx, title, tr, MU_COLOR_TITLETEXT, opt);
      if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
        cnt->rect.x += ctx->mouse_delta.x;
        cnt->rect.y += ctx->mouse_delta.y;
      }
      body.y += tr.h;
      body.h -= tr.h;
    }

    /* do `close` button */
    if (~opt & MU_OPT_NOCLOSE) {
      mu_Id id = mu_get_id(ctx, "!close", 6);
      mu_Rect r = mu_rect(tr.x + tr.w - tr.h, tr.y, tr.h, tr.h);
      tr.w -= r.w;
      mu_draw_icon(ctx, MU_ICON_CLOSE, r, ctx->style->colors[MU_COLOR_TITLETEXT]);
      mu_update_control(ctx, id, r, opt);
      if (ctx->mouse_pressed == MU_MOUSE_LEFT && id == ctx->focus) {
        cnt->open = 0;
      }
    }
  }

  push_container_body(ctx, cnt, body, opt);

  /* do `resize` handle */
  if (~opt & MU_OPT_NORESIZE) {
    int sz = ctx->style->title_height;
    mu_Id id = mu_get_id(ctx, "!resize", 7);
    mu_Rect r = mu_rect(rect.x + rect.w - sz, rect.y + rect.h - sz, sz, sz);
    mu_update_control(ctx, id, r, opt);
    if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
      cnt->rect.w = mu_max(96, cnt->rect.w + ctx->mouse_delta.x);
      cnt->rect.h = mu_max(64, cnt->rect.h + ctx->mouse_delta.y);
    }
  }

  /* resize to content size */
  if (opt & MU_OPT_AUTOSIZE) {
    mu_Rect r = get_layout(ctx)->body;
    cnt->rect.w = cnt->content_size.x + (cnt->rect.w - r.w);
    cnt->rect.h = cnt->content_size.y + (cnt->rect.h - r.h);
  }

  /* close if this is a popup window and elsewhere was clicked */
  if (opt & MU_OPT_POPUP && ctx->mouse_pressed && ctx->hover_root != cnt) {
    cnt->open = 0;
  }

  mu_push_clip_rect(ctx, cnt->body);
  return MU_RES_ACTIVE;
}